

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

void anon_unknown.dwarf_c130c::EncodeString<char>
               (DerType type,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
               uchar *out,size_t cbOut,size_t *cbUsed)

{
  size_t size;
  bool bVar1;
  length_error *this;
  code *pcVar2;
  long lVar3;
  undefined *puVar4;
  uchar local_48 [8];
  uchar encodedSize [8];
  size_t local_38;
  size_t cbUsedSize;
  
  size = in->_M_string_length;
  if (size == 0) {
    if (1 < cbOut) {
      out[0] = '\x05';
      out[1] = '\0';
      *cbUsed = 2;
      return;
    }
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this,"Overflow in EncodeString");
  }
  else {
    local_38 = 0;
    encodedSize = (uchar  [8])cbUsed;
    bVar1 = EncodeSize(size,local_48,8,&local_38);
    if (bVar1) {
      if (size + local_38 + 1 <= cbOut) {
        *out = (uchar)type;
        memcpy_s(out + 1,cbOut - 1,local_48,local_38);
        lVar3 = local_38 + 1;
        memcpy_s(out + local_38 + 1,cbOut - lVar3,(in->_M_dataplus)._M_p,in->_M_string_length);
        *(size_type *)encodedSize = lVar3 + in->_M_string_length;
        return;
      }
      this = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this,"Insufficient Buffer");
      puVar4 = &std::length_error::typeinfo;
      pcVar2 = std::length_error::~length_error;
      goto LAB_00139b3f;
    }
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error((overflow_error *)this,"Overflow in EncodeString");
  }
  puVar4 = &std::overflow_error::typeinfo;
  pcVar2 = std::overflow_error::~overflow_error;
LAB_00139b3f:
  __cxa_throw(this,puVar4,pcVar2);
}

Assistant:

void EncodeString(DerType type, const std::basic_string<T>& in, unsigned char* out, size_t cbOut, size_t& cbUsed)
	{
		// If it is empty, encode as Null
		if (in.size() == 0)
		{
			if (cbOut < 2)
				throw std::overflow_error("Overflow in EncodeString");

			out[0] = static_cast<unsigned char>(DerType::Null);
			out[1] = 0;
			cbUsed = 2;
			return;
		}

		const size_t charSize = sizeof(T);
		size_t cbUsedSize = 0;
		size_t cbNeeded = (in.size() + 1) * charSize; // Data, plus tag
		unsigned char encodedSize[sizeof(long long)];

		if (!EncodeSize(in.size() * charSize, encodedSize, sizeof(encodedSize), cbUsedSize))
		{
			throw std::overflow_error("Overflow in EncodeString");
		}

		// Note - cbUsedSize guaranteed to be <= 8, int overflow not possible
		cbNeeded += cbUsedSize;

		if (cbNeeded > cbOut)
			throw std::length_error("Insufficient Buffer");

		out[0] = static_cast<unsigned char>(type);
		size_t offset = 1;
		memcpy_s(out + offset, cbOut - offset, encodedSize, cbUsedSize);
		offset += cbUsedSize;
		memcpy_s(out + offset, cbOut - offset, &in[0], in.size() * charSize);

		cbUsed = offset + in.size() * charSize;
		return;
	}